

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O2

void __thiscall BasePort::BroadcastReadInfo::PrintTiming(BroadcastReadInfo *this,ostream *outStr)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  uint uVar4;
  char *pcVar5;
  uint bnum;
  long lVar6;
  BroadcastBoardInfo *pBVar7;
  double dVar8;
  
  std::operator<<(outStr,"Updates (usec): ");
  pBVar7 = this->boardInfo;
  uVar4 = 0;
  for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
    if (pBVar7->inUse == true) {
      dVar8 = pBVar7->updateTime;
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)outStr);
      poVar3 = std::operator<<(poVar3,": ");
      lVar1 = *(long *)poVar3;
      lVar2 = *(long *)(lVar1 + -0x18);
      *(uint *)(poVar3 + lVar2 + 0x18) = *(uint *)(poVar3 + lVar2 + 0x18) & 0xfffffefb | 4;
      *(undefined8 *)(poVar3 + *(long *)(lVar1 + -0x18) + 8) = 2;
      poVar3 = std::ostream::_M_insert<double>(dVar8 * 1000000.0);
      std::operator<<(poVar3,"   ");
      uVar4 = uVar4 + 1;
    }
    pBVar7 = pBVar7 + 1;
  }
  dVar8 = (this->updateFinishTime - this->updateStartTime) * 1000000.0;
  poVar3 = std::operator<<(outStr,"Range: ");
  lVar6 = *(long *)poVar3;
  lVar1 = *(long *)(lVar6 + -0x18);
  *(uint *)(poVar3 + lVar1 + 0x18) = *(uint *)(poVar3 + lVar1 + 0x18) & 0xfffffefb | 4;
  *(undefined8 *)(poVar3 + *(long *)(lVar6 + -0x18) + 8) = 2;
  std::ostream::_M_insert<double>(dVar8);
  if (1 < uVar4) {
    std::operator<<(outStr," (");
    poVar3 = std::ostream::_M_insert<double>(dVar8 / (double)(uVar4 - 1));
    std::operator<<(poVar3,") ");
  }
  pcVar5 = "   ";
  if (this->updateOverflow != false) {
    pcVar5 = "OVF";
  }
  std::operator<<(outStr,pcVar5);
  std::endl<char,std::char_traits<char>>(outStr);
  poVar3 = std::operator<<(outStr,"Read start: ");
  lVar6 = *(long *)poVar3;
  *(uint *)(poVar3 + *(long *)(lVar6 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(lVar6 + -0x18) + 0x18) & 0xfffffefb | 4;
  *(undefined8 *)(poVar3 + *(long *)(lVar6 + -0x18) + 8) = 2;
  *(undefined8 *)(poVar3 + *(long *)(lVar6 + -0x18) + 0x10) = 6;
  poVar3 = std::ostream::_M_insert<double>(this->readStartTime * 1000000.0);
  poVar3 = std::operator<<(poVar3,"  finish: ");
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 6;
  poVar3 = std::ostream::_M_insert<double>(this->readFinishTime * 1000000.0);
  std::operator<<(poVar3,"  delta: ");
  poVar3 = std::ostream::_M_insert<double>((this->readFinishTime - this->readStartTime) * 1000000.0)
  ;
  poVar3 = std::operator<<(poVar3,"  gap: ");
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 6;
  std::ostream::_M_insert<double>(this->gapTime * 1000000.0);
  if (((this->gapTimeMin != 1.0) || (NAN(this->gapTimeMin))) &&
     ((this->gapTimeMax != 0.0 || (NAN(this->gapTimeMax))))) {
    poVar3 = std::operator<<(outStr," (min ");
    *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 6;
    poVar3 = std::ostream::_M_insert<double>(this->gapTimeMin * 1000000.0);
    std::operator<<(poVar3,", max ");
    poVar3 = std::ostream::_M_insert<double>(this->gapTimeMax * 1000000.0);
    std::operator<<(poVar3,") ");
  }
  pcVar5 = "   ";
  if (this->readOverflow != false) {
    pcVar5 = "OVF";
  }
  std::operator<<(outStr,pcVar5);
  std::endl<char,std::char_traits<char>>(outStr);
  return;
}

Assistant:

void BasePort::BroadcastReadInfo::PrintTiming(std::ostream &outStr) const
{
    unsigned int num_bds = 0;
    outStr << "Updates (usec): ";
    for (unsigned int bnum = 0; bnum < BoardIO::MAX_BOARDS; bnum++) {
        if (boardInfo[bnum].inUse) {
            double bdTime_us = boardInfo[bnum].updateTime*1e6;
            outStr << bnum << ": " << std::fixed << std::setprecision(2) << bdTime_us
                   << "   ";
            num_bds++;
        }
    }
    double bdTimeDiff_us = (updateFinishTime-updateStartTime)*1e6;
    outStr << "Range: " << std::fixed << std::setprecision(2) << bdTimeDiff_us;
    if (num_bds > 1)
        outStr << " (" << (bdTimeDiff_us/(num_bds-1)) << ") ";
    outStr << (updateOverflow ? "OVF" : "   ");
    outStr << std::endl;
    outStr << "Read start: " << std::fixed << std::setprecision(2) << std::setw(6) << (readStartTime*1e6)
           << "  finish: " << std::setw(6) << (readFinishTime*1e6) << "  delta: " << ((readFinishTime-readStartTime)*1e6)
           << "  gap: " << std::setw(6) << (gapTime*1e6);
    if ((gapTimeMin != 1.0) && (gapTimeMax != 0.0)) {
        outStr << " (min " << std::setw(6) << (gapTimeMin*1e6) << ", max " << (gapTimeMax*1e6) << ") ";
    }
    outStr << (readOverflow ? "OVF" : "   ");
    outStr << std::endl;
}